

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.cpp
# Opt level: O2

AnimInterpolator * rw::AnimInterpolator::create(int32 numNodes,int32 maxFrameSize)

{
  FILE *__stream;
  AnimInterpolator *pAVar1;
  char *pcVar2;
  uint uVar3;
  Error _e;
  Error local_28;
  
  uVar3 = (maxFrameSize + 0x10) * numNodes + 0x48;
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/anim.cpp line: 197";
  pAVar1 = (AnimInterpolator *)(*Engine::memfuncs)((long)(int)uVar3,0x3001b);
  if (pAVar1 == (AnimInterpolator *)0x0) {
    local_28.plugin = 0x1b;
    local_28.code = 0x80000002;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/anim.cpp",199);
    __stream = _stderr;
    pcVar2 = dbgsprint(0x80000002,(ulong)uVar3);
    fprintf(__stream,"%s\n",pcVar2);
    setError(&local_28);
  }
  else {
    pAVar1->currentAnim = (Animation *)0x0;
    pAVar1->currentTime = 0.0;
    pAVar1->nextFrame = (void *)0x0;
    pAVar1->maxInterpKeyFrameSize = maxFrameSize;
    pAVar1->currentInterpKeyFrameSize = maxFrameSize;
    pAVar1->currentAnimKeyFrameSize = -1;
    pAVar1->numNodes = numNodes;
  }
  return pAVar1;
}

Assistant:

AnimInterpolator*
AnimInterpolator::create(int32 numNodes, int32 maxFrameSize)
{
	AnimInterpolator *interp;
	int32 sz;
	int32 realsz = maxFrameSize;

	// Add some space for pointers and padding, hopefully this will be
	// enough. Don't change maxFrameSize not to mess up streaming.
	if(sizeof(void*) > 4)
		realsz += 16;
	sz = sizeof(AnimInterpolator) + numNodes*realsz;
	interp = (AnimInterpolator*)rwMalloc(sz, MEMDUR_EVENT | ID_ANIMANIMATION);
	if(interp == nil){
		RWERROR((ERR_ALLOC, sz));
		return nil;
	}
	interp->currentAnim = nil;
	interp->currentTime = 0.0f;
	interp->nextFrame = nil;
	interp->maxInterpKeyFrameSize = maxFrameSize;
	interp->currentInterpKeyFrameSize = maxFrameSize;
	interp->currentAnimKeyFrameSize = -1;
	interp->numNodes = numNodes;;

	return interp;
}